

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall DirectionCone_VectorInCone_Test::TestBody(DirectionCone_VectorInCone_Test *this)

{
  long *plVar1;
  undefined8 uVar2;
  byte bVar3;
  uint64_t uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  double dVar19;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var_00 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [64];
  float fVar40;
  float fVar41;
  AssertionResult gtest_ar;
  DirectionCone dc;
  AssertHelper local_1a0;
  Vector3<float> local_198;
  float local_18c;
  RNG local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  internal local_148 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  Tuple3<pbrt::Vector3,_float> local_138;
  undefined1 local_128 [16];
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  AssertHelper local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_68;
  DirectionCone local_60;
  undefined1 local_48 [16];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  local_188.state = 0x853c49e6748fea9b;
  local_188.inc = 0xda3e39cb94b95bdb;
  local_68 = 0;
  do {
    RandomCone(&local_60,&local_188);
    iVar7 = 0;
    uVar11 = local_188.state;
    do {
      uVar4 = local_188.inc;
      uVar10 = uVar11 * 0x5851f42d4c957f2d + local_188.inc;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar11;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar10;
      auVar20 = vpunpcklqdq_avx(auVar25,auVar15);
      auVar14 = vpsrlvq_avx2(auVar20,_DAT_005c85c0);
      auVar15 = vpsrlvq_avx2(auVar20,_DAT_005c85b0);
      auVar14 = vpshufd_avx(auVar15 ^ auVar14,0xe8);
      auVar20 = vpsrlq_avx(auVar20,0x3b);
      auVar20 = vpshufd_avx(auVar20,0xe8);
      auVar14 = vprorvd_avx512vl(auVar14,auVar20);
      auVar20 = vcvtudq2ps_avx512vl(auVar14);
      auVar14._8_4_ = 0x2f800000;
      auVar14._0_8_ = 0x2f8000002f800000;
      auVar14._12_4_ = 0x2f800000;
      auVar15 = vmulps_avx512vl(auVar20,auVar14);
      auVar20._8_4_ = 0x3f7fffff;
      auVar20._0_8_ = 0x3f7fffff3f7fffff;
      auVar20._12_4_ = 0x3f7fffff;
      uVar12 = vcmpps_avx512vl(auVar15,auVar20,1);
      bVar3 = (byte)(uVar12 >> 1);
      auVar14 = vmovshdup_avx(auVar15);
      local_178._0_4_ = auVar15._0_4_ * 6.2831855;
      local_d8 = vfmadd132ss_fma(ZEXT416((uint)(bVar3 & 1) * auVar14._0_4_ +
                                         (uint)!(bool)(bVar3 & 1) * 0x3f7fffff),
                                 SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
      auVar14 = vfnmadd213ss_fma(local_d8,local_d8,SUB6416(ZEXT464(0x3f800000),0));
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0));
      if (auVar14._0_4_ < 0.0) {
        local_168._0_4_ = (int)uVar12;
        local_178 = ZEXT416((uint)local_178._0_4_);
        auVar36._0_4_ = sqrtf(auVar14._0_4_);
        auVar36._4_60_ = extraout_var;
        local_158 = auVar36._0_16_;
        uVar12 = (ulong)(uint)local_168._0_4_;
      }
      else {
        local_158 = vsqrtss_avx(auVar14,auVar14);
      }
      fVar13 = (float)((uint)((byte)uVar12 & 1) * local_178._0_4_ +
                      (uint)!(bool)((byte)uVar12 & 1) * 0x40c90fda);
      local_178 = ZEXT416((uint)fVar13);
      local_168._0_4_ = cosf(fVar13);
      local_168._4_4_ = extraout_XMM0_Db;
      local_168._8_4_ = extraout_XMM0_Dc;
      local_168._12_4_ = extraout_XMM0_Dd;
      auVar34._0_4_ = sinf((float)local_178._0_4_);
      auVar34._4_60_ = extraout_var_00;
      auVar14 = vinsertps_avx(auVar34._0_16_,ZEXT416((uint)local_168._0_4_),0x10);
      local_a8._0_4_ = (float)local_158._0_4_ * auVar14._0_4_;
      local_a8._4_4_ = (float)local_158._0_4_ * auVar14._4_4_;
      local_a8._8_4_ = (float)local_158._0_4_ * auVar14._8_4_;
      local_a8._12_4_ = (float)local_158._0_4_ * auVar14._12_4_;
      local_78 = vmovshdup_avx(local_a8);
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a8._0_4_ * (float)local_a8._0_4_)),
                                local_78,local_78);
      auVar14 = vfmadd231ss_fma(auVar14,local_d8,local_d8);
      fVar13 = auVar14._0_4_;
      local_158._0_4_ = fVar13;
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
        auVar14 = ZEXT416((uint)local_158._0_4_);
      }
      else {
        auVar20 = vsqrtss_avx(auVar14,auVar14);
        fVar13 = auVar20._0_4_;
      }
      auVar26._4_4_ = fVar13;
      auVar26._0_4_ = fVar13;
      auVar26._8_4_ = fVar13;
      auVar26._12_4_ = fVar13;
      auVar20 = vdivps_avx(local_a8,auVar26);
      auVar15 = vmovshdup_avx(auVar20);
      local_128._0_4_ = local_d8._0_4_ / fVar13;
      local_128._4_12_ = local_d8._4_12_;
      local_168._8_8_ = 0;
      local_168._0_4_ = local_60.w.super_Tuple3<pbrt::Vector3,_float>.x;
      local_168._4_4_ = local_60.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar36 = ZEXT1664(local_168);
      local_b8 = vmovshdup_avx(local_168);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * local_b8._0_4_)),auVar15,local_168);
      local_178 = ZEXT416((uint)local_60.w.super_Tuple3<pbrt::Vector3,_float>.z);
      auVar25 = vfmadd213ss_fma(local_178,local_128,auVar26);
      local_f8 = ZEXT416((uint)local_60.cosTheta);
      if (auVar25._0_4_ <= local_60.cosTheta) {
        auVar14 = vfnmadd213ss_fma(local_f8,local_f8,ZEXT416(0x3f800000));
        auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
        local_18c = auVar26._0_4_;
        local_98 = auVar20;
        if (auVar14._0_4_ < 0.0) {
          local_e8 = auVar15;
          auVar23._0_4_ = sqrtf(auVar14._0_4_);
          auVar23._4_60_ = extraout_var_01;
          auVar36 = ZEXT1664(local_168);
          auVar14 = auVar23._0_16_;
          auVar15 = local_e8;
        }
        else {
          auVar14 = vsqrtss_avx(auVar14,auVar14);
        }
        fVar13 = auVar14._0_4_;
        auVar20 = ZEXT416((uint)(local_b8._0_4_ * (float)local_128._0_4_));
        auVar25 = vfmsub213ss_fma(local_178,local_98,auVar20);
        auVar22 = vfnmadd231ss_fma(auVar20,local_128,local_b8);
        auVar21 = ZEXT416((uint)(local_178._0_4_ * auVar15._0_4_));
        auVar26 = vfmsub213ss_fma(auVar36._0_16_,local_128,auVar21);
        auVar20 = vshufps_avx(local_98,local_98,0xe1);
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar16 = vxorps_avx512vl(auVar20,auVar29);
        auVar20 = vshufps_avx(auVar16,auVar16,0xf5);
        auVar29 = vfnmadd213ss_fma(auVar15,local_178,auVar21);
        fVar18 = auVar29._0_4_ + auVar26._0_4_;
        auVar29 = ZEXT416((uint)(local_98._0_4_ * auVar36._0_4_));
        auVar26 = vfmsub213ss_fma(local_b8,auVar15,auVar29);
        auVar20 = vfmadd213ss_fma(auVar20,auVar36._0_16_,auVar29);
        auVar15 = ZEXT416((uint)(auVar25._0_4_ + auVar22._0_4_));
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),auVar15,auVar15);
        auVar20 = ZEXT416((uint)(auVar26._0_4_ + auVar20._0_4_));
        auVar20 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
        if (auVar20._0_4_ < 0.0) {
          local_e8 = auVar16;
          local_88 = auVar14;
          fVar18 = sqrtf(auVar20._0_4_);
          fVar13 = local_88._0_4_;
          auVar36 = ZEXT1664(local_168);
          auVar16 = local_e8;
        }
        else {
          auVar14 = vsqrtss_avx(auVar20,auVar20);
          fVar18 = auVar14._0_4_;
        }
        auVar14 = ZEXT416((uint)local_158._0_4_);
        fVar41 = local_f8._0_4_;
        fVar35 = auVar36._0_4_;
        fVar37 = auVar36._4_4_;
        fVar38 = auVar36._8_4_;
        fVar39 = auVar36._12_4_;
        fVar40 = local_178._0_4_;
        fVar18 = -fVar13 / fVar18;
        fVar13 = fVar40 * (float)local_128._0_4_;
        auVar26 = auVar36._0_16_;
        auVar15 = vshufps_avx(auVar26,auVar26,0xe1);
        auVar33._0_4_ = fVar35 * fVar35;
        auVar33._4_4_ = fVar37 * fVar37;
        auVar33._8_4_ = fVar38 * fVar38;
        auVar33._12_4_ = fVar39 * fVar39;
        auVar25 = vshufps_avx(auVar33,auVar33,0xe1);
        fVar28 = fVar40 * fVar40;
        auVar20 = vhaddps_avx(auVar33,auVar33);
        auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_18c),local_178,
                                  ZEXT416((uint)(auVar20._0_4_ * -(float)local_128._0_4_)));
        local_128 = ZEXT416((uint)(fVar40 * fVar41 + auVar20._0_4_ * fVar18));
        auVar21._4_4_ = fVar13;
        auVar21._0_4_ = fVar13;
        auVar21._8_4_ = fVar13;
        auVar21._12_4_ = fVar13;
        auVar20 = vfmadd231ps_fma(auVar21,local_98,auVar15);
        auVar30._0_4_ = auVar16._0_4_ * (auVar25._0_4_ + fVar28);
        auVar30._4_4_ = auVar16._4_4_ * (auVar25._4_4_ + fVar28);
        auVar30._8_4_ = auVar16._8_4_ * (auVar25._8_4_ + fVar28);
        auVar30._12_4_ = auVar16._12_4_ * (auVar25._12_4_ + fVar28);
        auVar20 = vfmadd231ps_fma(auVar30,auVar26,auVar20);
        auVar22._0_4_ = fVar35 * fVar41 + auVar20._0_4_ * fVar18;
        auVar22._4_4_ = fVar37 * fVar41 + auVar20._4_4_ * fVar18;
        auVar22._8_4_ = fVar38 * fVar41 + auVar20._8_4_ * fVar18;
        auVar22._12_4_ = fVar39 * fVar41 + auVar20._12_4_ * fVar18;
      }
      else {
        auVar22 = vshufps_avx(auVar20,auVar20,0xe1);
      }
      uVar11 = uVar10 * 0x5851f42d4c957f2d + uVar4;
      local_138._0_8_ = vmovlps_avx(auVar22);
      local_138.z = local_128._0_4_;
      if (local_60.empty == false) {
        if (auVar14._0_4_ < 0.0) {
          fVar13 = sqrtf(auVar14._0_4_);
          auVar36 = ZEXT1664(local_168);
        }
        else {
          auVar14 = vsqrtss_avx(auVar14,auVar14);
          fVar13 = auVar14._0_4_;
        }
        auVar27._0_4_ = local_78._0_4_ / fVar13;
        auVar27._4_12_ = local_78._4_12_;
        auVar16._0_4_ = local_d8._0_4_ / fVar13;
        auVar16._4_12_ = local_d8._4_12_;
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_a8._0_4_ / fVar13) *
                                                (float)local_b8._0_4_)),auVar36._0_16_,auVar27);
        auVar14 = vfmadd231ss_fma(auVar14,local_178,auVar16);
        if (auVar14._0_4_ < local_f8._0_4_) goto LAB_003387ec;
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a8._0_4_ * local_138.y)),local_78,
                                  ZEXT416((uint)local_138.x));
        auVar14 = vfmadd213ss_fma(local_d8,local_128,auVar14);
        local_1a0.data_._0_4_ = auVar14._0_4_;
        local_198.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &DAT_3feff7ced916872b;
        testing::internal::CmpHelperGT<float,double>
                  (local_148,"Dot(wClosest, wRandom)",".999",(float *)&local_1a0,
                   (double *)&local_198);
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_198);
          pcVar8 = "";
          if (local_140.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = ((local_140.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1c6,pcVar8);
          testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_198);
          testing::internal::AssertHelper::~AssertHelper(&local_1a0);
          if ((long *)local_198.super_Tuple3<pbrt::Vector3,_float>._0_8_ != (long *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) &&
               ((long *)local_198.super_Tuple3<pbrt::Vector3,_float>._0_8_ != (long *)0x0)) {
              (**(code **)(*(long *)local_198.super_Tuple3<pbrt::Vector3,_float>._0_8_ + 8))();
            }
            local_198.super_Tuple3<pbrt::Vector3,_float>._0_8_ = (long *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
LAB_003387ec:
        fVar13 = auVar36._0_4_;
        auVar14 = vfnmadd213ss_fma(local_f8,local_f8,ZEXT416(0x3f800000));
        auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x40);
        if (auVar14._0_4_ < 0.0) {
          auVar24._0_4_ = sqrtf(auVar14._0_4_);
          auVar24._4_60_ = extraout_var_02;
          auVar14 = auVar24._0_16_;
          fVar13 = local_168._0_4_;
        }
        else {
          auVar14 = vsqrtss_avx(auVar14,auVar14);
        }
        auVar31._8_4_ = 0x3f800000;
        auVar31._0_8_ = 0x3f8000003f800000;
        auVar31._12_4_ = 0x3f800000;
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar15 = vpternlogd_avx512vl(auVar31,local_178,auVar32,0xf8);
        fVar18 = auVar15._0_4_;
        auVar34 = ZEXT464(0xbf800000);
        fVar28 = -1.0 / (local_178._0_4_ + fVar18);
        local_fc = fVar13 * (float)local_b8._0_4_ * fVar28;
        auVar20 = vfmadd213ss_fma(ZEXT416((uint)(fVar13 * fVar13 * fVar18)),ZEXT416((uint)fVar28),
                                  auVar31);
        local_88._0_4_ = auVar20._0_4_;
        local_e8._0_4_ = local_fc;
        local_fc = local_fc * fVar18;
        local_100 = fVar13 * -fVar18;
        auVar20 = vfmadd213ss_fma(ZEXT416((uint)((float)local_b8._0_4_ * (float)local_b8._0_4_)),
                                  ZEXT416((uint)fVar28),auVar15);
        local_104 = auVar20._0_4_;
        local_198.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_198.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_198.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        auVar20 = vminss_avx(auVar31,auVar14);
        uVar2 = vcmpss_avx512f(auVar14,auVar34._0_16_,1);
        bVar5 = (bool)((byte)uVar2 & 1);
        local_158._4_12_ = auVar20._4_12_;
        local_158._0_4_ = (uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar20._0_4_;
        auVar14 = vminss_avx(auVar31,local_f8);
        uVar2 = vcmpss_avx512f(local_f8,auVar34._0_16_,1);
        bVar5 = (bool)((byte)uVar2 & 1);
        local_110 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar14._0_4_);
        local_108 = fVar13 * local_110;
        local_10c = (float)local_b8._0_4_ * local_110;
        local_110 = local_178._0_4_ * local_110;
        local_48._0_12_ = ZEXT812(0);
        local_48._12_4_ = 0;
        auVar36 = ZEXT464(0) << 0x20;
        iVar9 = 1000;
        auVar17 = ZEXT816(0) << 0x20;
        do {
          local_f8._0_4_ = auVar34._0_4_;
          local_178._0_8_ = auVar36._0_8_;
          dVar19 = (auVar36._0_8_ + 0.5) / 1000.0;
          local_18c = (float)((dVar19 + dVar19) * 3.1415927410125732);
          local_168 = auVar17;
          fVar13 = cosf(local_18c);
          local_98._0_4_ = fVar13 * (float)local_158._0_4_;
          fVar28 = sinf(local_18c);
          fVar28 = fVar28 * (float)local_158._0_4_;
          fVar13 = (float)local_98._0_4_ * local_fc + fVar28 * local_104 + local_10c;
          fVar18 = ((float)local_98._0_4_ * local_100 - fVar28 * (float)local_b8._0_4_) + local_110;
          auVar20 = ZEXT416((uint)((float)local_98._0_4_ * (float)local_88._0_4_ +
                                   fVar28 * (float)local_e8._0_4_ + local_108));
          auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * (float)local_a8._0_4_)),auVar20,
                                    ZEXT416((uint)local_78._0_4_));
          auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar18),ZEXT416((uint)local_d8._0_4_));
          if ((float)local_f8._0_4_ < auVar14._0_4_) {
            local_48 = vinsertps_avx(auVar20,ZEXT416((uint)fVar13),0x10);
          }
          uVar2 = vcmpss_avx512f(ZEXT416((uint)local_f8._0_4_),auVar14,1);
          bVar5 = (bool)((byte)uVar2 & 1);
          auVar17._4_12_ = local_168._4_12_;
          auVar17._0_4_ = (float)((uint)bVar5 * (int)fVar18 + (uint)!bVar5 * local_168._0_4_);
          auVar14 = vmaxss_avx(auVar14,ZEXT416((uint)local_f8._0_4_));
          auVar34 = ZEXT1664(auVar14);
          auVar36 = ZEXT864((ulong)((double)local_178._0_8_ + 1.0));
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
        plVar1 = (long *)vmovlps_avx(local_48);
        local_198.super_Tuple3<pbrt::Vector3,_float>.x = SUB84(plVar1,0);
        local_198.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)plVar1 >> 0x20);
        auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_198.super_Tuple3<pbrt::Vector3,_float>.y *
                                                local_138.y)),
                                  ZEXT416((uint)local_198.super_Tuple3<pbrt::Vector3,_float>.x),
                                  ZEXT416((uint)local_138.x));
        local_128 = vfmadd213ss_fma(local_128,auVar17,auVar14);
        local_c0.data_._0_4_ = local_128._0_4_;
        local_1a0.data_ = (AssertHelperData *)&DAT_3feff7ced916872b;
        local_198.super_Tuple3<pbrt::Vector3,_float>._0_8_ = plVar1;
        local_198.super_Tuple3<pbrt::Vector3,_float>.z = auVar17._0_4_;
        testing::internal::CmpHelperGT<float,double>
                  (local_148,"Dot(wBest, wClosest)",".999",(float *)&local_c0,(double *)&local_1a0);
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a0);
          pbrt::operator<<((ostream *)&(local_1a0.data_)->line,&local_198);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_1a0.data_)->line," vs ",4);
          pbrt::operator<<((ostream *)&(local_1a0.data_)->line,(Vector3<float> *)&local_138);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_1a0.data_)->line,", dot ",6);
          std::ostream::_M_insert<double>((double)(float)local_128._0_4_);
          pcVar8 = "";
          if (local_140.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = ((local_140.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1d9,pcVar8);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_1a0.data_ != (AssertHelperData *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) && (local_1a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_1a0.data_ + 8))();
            }
            local_1a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 100);
    uVar6 = (int)local_68 + 1;
    local_68 = (ulong)uVar6;
    local_188.state = uVar11;
    if (uVar6 == 100) {
      return;
    }
  } while( true );
}

Assistant:

TEST(DirectionCone, VectorInCone) {
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        DirectionCone dc = RandomCone(rng);

        for (int j = 0; j < 100; ++j) {
            Vector3f wRandom =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            Vector3f wClosest = dc.ClosestVectorInCone(wRandom);

            if (Inside(dc, wRandom))
                EXPECT_GT(Dot(wClosest, wRandom), .999);
            else {
                // Uniformly sample the circle at the cone's boundary and
                // keep the vector that's closest to wRandom.
                Float sinTheta = SafeSqrt(1 - dc.cosTheta * dc.cosTheta);
                Frame f = Frame::FromZ(dc.w);

                Vector3f wBest;
                Float bestDot = -1;
                const int nk = 1000;
                for (int k = 0; k < nk; ++k) {
                    Float phi = (k + .5) / nk * 2 * Pi;
                    Vector3f w = SphericalDirection(sinTheta, dc.cosTheta, phi);
                    w = f.FromLocal(w);
                    if (Dot(w, wRandom) > bestDot) {
                        wBest = w;
                        bestDot = Dot(w, wRandom);
                    }
                }
                EXPECT_GT(Dot(wBest, wClosest), .999)
                    << wBest << " vs " << wClosest << ", dot " << Dot(wBest, wClosest);
            }
        }
    }
}